

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Base64.cc
# Opt level: O2

void __thiscall Pl_Base64::decode(Pl_Base64 *this,uchar *data,size_t len)

{
  byte bVar1;
  size_t sVar2;
  size_t sVar3;
  
  for (sVar3 = 0; len != sVar3; sVar3 = sVar3 + 1) {
    bVar1 = data[sVar3];
    if ((0x20 < (ulong)bVar1) || ((0x100003e00U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      sVar2 = this->pos;
      this->pos = sVar2 + 1;
      this->buf[sVar2] = bVar1;
      if (this->pos == 4) {
        flush(this);
      }
    }
  }
  return;
}

Assistant:

void
Pl_Base64::decode(unsigned char const* data, size_t len)
{
    unsigned char const* p = data;
    while (len > 0) {
        if (!util::is_space(to_c(*p))) {
            this->buf[this->pos++] = *p;
            if (this->pos == 4) {
                flush();
            }
        }
        ++p;
        --len;
    }
}